

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  undefined1 (*rankStats) [32];
  undefined8 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  char cVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  uint *puVar23;
  U32 current_1;
  ulong uVar24;
  int iVar25;
  size_t sVar26;
  size_t sVar27;
  uint uVar28;
  U32 *rankVal0;
  uint uVar29;
  undefined1 auVar30 [16];
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  uint local_f8;
  uint local_f4 [19];
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined4 uStack_98;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 uStack_84;
  undefined8 uStack_7c;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined4 uStack_58;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  sVar26 = 0xffffffffffffffd4;
  sVar27 = sVar26;
  if (0x5db < wkspSize) {
    uVar5 = *DTable;
    uVar9 = uVar5 & 0xff;
    rankStats = (undefined1 (*) [32])((long)workSpace + 0x270);
    auVar30 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])((long)workSpace + 700) = ZEXT1632(auVar30);
    *(undefined1 (*) [32])((long)workSpace + 0x2b0) = ZEXT1632(auVar30);
    *(undefined1 (*) [32])((long)workSpace + 0x290) = ZEXT1632(auVar30);
    *rankStats = ZEXT1632(auVar30);
    if ((uVar9 < 0xd) &&
       (sVar12 = HUF_readStats((BYTE *)((long)workSpace + 0x4dc),0x100,(U32 *)rankStats,&local_f8,
                               local_f4,src,srcSize), sVar27 = sVar12, sVar12 < 0xffffffffffffff89))
    {
      cVar8 = (char)uVar5;
      sVar27 = sVar26;
      if (local_f4[0] <= uVar9) {
        uVar10 = 0;
        uVar14 = local_f4[0];
        do {
          uVar18 = (ulong)uVar14;
          uVar14 = uVar14 - 1;
          uVar10 = uVar10 + 1;
        } while (*(U32 *)((long)*rankStats + uVar18 * 4) == 0);
        uVar14 = (local_f4[0] - uVar10) + 2;
        uVar29 = 0;
        if (1 < uVar14) {
          lVar17 = 0;
          uVar22 = 0;
          do {
            uVar29 = *(int *)((long)workSpace + lVar17 * 4 + 0x274) + uVar22;
            *(uint *)((long)workSpace + lVar17 * 4 + 0x2ac) = uVar22;
            lVar17 = lVar17 + 1;
            uVar22 = uVar29;
          } while ((ulong)uVar14 - 1 != lVar17);
        }
        *(uint *)((long)workSpace + 0x2a8) = uVar29;
        if ((ulong)local_f8 != 0) {
          uVar18 = 0;
          do {
            bVar2 = *(byte *)((long)workSpace + uVar18 + 0x4dc);
            uVar22 = *(uint *)((long)workSpace + (ulong)bVar2 * 4 + 0x2a8);
            *(uint *)((long)workSpace + (ulong)bVar2 * 4 + 0x2a8) = uVar22 + 1;
            *(char *)((long)workSpace + (ulong)uVar22 * 2 + 0x2dc) = (char)uVar18;
            *(byte *)((long)workSpace + (ulong)uVar22 * 2 + 0x2dd) = bVar2;
            uVar18 = uVar18 + 1;
          } while (local_f8 != uVar18);
        }
        uVar22 = (uVar9 - uVar10) + 1;
        *(undefined4 *)((long)workSpace + 0x2a8) = 0;
        if (1 < uVar14) {
          lVar17 = 0;
          iVar25 = 0;
          do {
            lVar19 = lVar17 * 4;
            cVar7 = (char)lVar17;
            *(int *)((long)workSpace + lVar17 * 4 + 4) = iVar25;
            lVar17 = lVar17 + 1;
            iVar25 = (*(int *)((long)workSpace + lVar19 + 0x274) <<
                     (cVar7 + (cVar8 - (char)local_f4[0]) & 0x1fU)) + iVar25;
          } while ((ulong)uVar14 - 1 != lVar17);
        }
        if (uVar10 < uVar22) {
          uVar18 = (ulong)uVar10;
          lVar17 = uVar18 * 0x34;
          do {
            lVar19 = (ulong)uVar14 - 1;
            puVar23 = (uint *)((long)workSpace + 4);
            if (1 < uVar14) {
              do {
                *(uint *)((long)puVar23 + lVar17) = *puVar23 >> ((byte)uVar18 & 0x1f);
                lVar19 = lVar19 + -1;
                puVar23 = puVar23 + 1;
              } while (lVar19 != 0);
            }
            uVar18 = uVar18 + 1;
            lVar17 = lVar17 + 0x34;
          } while (uVar22 != (uint)uVar18);
        }
        uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x1c) >> 0x20);
        uStack_44 = *(undefined8 *)((long)workSpace + 0x24);
        uStack_3c = *(undefined8 *)((long)workSpace + 0x2c);
        uStack_68 = *workSpace;
        uStack_60 = *(undefined8 *)((long)workSpace + 8);
        uStack_58 = (undefined4)*(undefined8 *)((long)workSpace + 0x10);
        local_54 = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x10) >> 0x20);
        uStack_50 = (undefined4)*(undefined8 *)((long)workSpace + 0x18);
        uStack_4c = (undefined4)((ulong)*(undefined8 *)((long)workSpace + 0x18) >> 0x20);
        if (uVar29 != 0) {
          iVar25 = local_f4[0] + 1;
          uVar18 = 0;
          do {
            uVar22 = (uint)*(byte *)((long)workSpace + uVar18 * 2 + 0x2dc);
            bVar2 = *(byte *)((long)workSpace + uVar18 * 2 + 0x2dd);
            uVar28 = iVar25 - (uint)bVar2;
            uVar14 = *(uint *)((long)&uStack_68 + (ulong)bVar2 * 4);
            uVar20 = (ulong)uVar14;
            bVar13 = (byte)(uVar9 - uVar28);
            iVar11 = 1 << (bVar13 & 0x1f);
            if (uVar9 - uVar28 < uVar10) {
              uVar15 = iVar11 + uVar14;
              if (uVar14 < uVar15) {
                do {
                  DTable[uVar20 + 1] = (uVar28 & 0xff) * 0x10000 + uVar22 + 0x1000000;
                  uVar20 = uVar20 + 1;
                } while (uVar15 != uVar20);
              }
            }
            else {
              uVar15 = (iVar25 - uVar9) + uVar28;
              uVar21 = 1;
              if (1 < (int)uVar15) {
                uVar21 = (ulong)uVar15;
              }
              uVar6 = *(uint *)((long)workSpace + uVar21 * 4 + 0x2a4);
              lVar17 = (ulong)uVar28 * 0x34;
              puVar1 = (undefined8 *)((long)workSpace + lVar17);
              uStack_88 = (undefined4)
                          ((ulong)*(undefined8 *)((long)workSpace + lVar17 + 0x1c) >> 0x20);
              uStack_84 = *(undefined8 *)((long)workSpace + lVar17 + 0x24);
              uStack_7c = *(undefined8 *)((long)workSpace + lVar17 + 0x2c);
              uStack_a8 = *puVar1;
              uStack_a0 = puVar1[1];
              uStack_98 = (undefined4)puVar1[2];
              local_94 = (undefined4)((ulong)puVar1[2] >> 0x20);
              uStack_90 = (undefined4)puVar1[3];
              uStack_8c = (undefined4)((ulong)puVar1[3] >> 0x20);
              if ((1 < (int)uVar15) &&
                 (uVar21 = (ulong)*(uint *)((long)&uStack_a8 + uVar21 * 4), uVar21 != 0)) {
                uVar24 = 0;
                do {
                  DTable[uVar20 + uVar24 + 1] = (uVar28 & 0xff) * 0x10000 + uVar22 + 0x1000000;
                  uVar24 = uVar24 + 1;
                } while (uVar21 != uVar24);
              }
              if (uVar29 != uVar6) {
                uVar21 = 0;
                do {
                  bVar3 = *(byte *)((long)workSpace + uVar21 * 2 + (ulong)uVar6 * 2 + 0x2dc);
                  bVar4 = *(byte *)((long)workSpace + uVar21 * 2 + (ulong)uVar6 * 2 + 0x2dd);
                  uVar15 = *(uint *)((long)&uStack_a8 + (ulong)bVar4 * 4);
                  uVar16 = (1 << (bVar13 - (char)(iVar25 - (uint)bVar4) & 0x1f)) + uVar15;
                  do {
                    uVar24 = (ulong)uVar15;
                    uVar15 = uVar15 + 1;
                    DTable[uVar20 + uVar24 + 1] =
                         uVar22 + (((iVar25 - (uint)bVar4) + uVar28 & 0xff) << 0x10 |
                                  (uint)bVar3 << 8) + 0x2000000;
                  } while (uVar15 < uVar16);
                  *(uint *)((long)&uStack_a8 + (ulong)bVar4 * 4) = uVar16;
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar29 - uVar6);
              }
            }
            *(uint *)((long)&uStack_68 + (ulong)bVar2 * 4) = iVar11 + uVar14;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar29);
        }
        *(char *)DTable = cVar8;
        *(undefined1 *)((long)DTable + 1) = 1;
        *(char *)((long)DTable + 2) = cVar8;
        *(char *)((long)DTable + 3) = (char)(uVar5 >> 0x18);
        sVar27 = sVar12;
      }
    }
  }
  return sVar27;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    rankValCol_t* rankVal;
    U32* rankStats;
    U32* rankStart0;
    sortedSymbol_t* sortedSymbol;
    BYTE* weightList;
    size_t spaceUsed32 = 0;

    rankVal = (rankValCol_t *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += (sizeof(rankValCol_t) * HUF_TABLELOG_MAX) >> 2;
    rankStats = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 1;
    rankStart0 = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_MAX + 2;
    sortedSymbol = (sortedSymbol_t *)workSpace + (spaceUsed32 * sizeof(U32)) / sizeof(sortedSymbol_t);
    spaceUsed32 += HUF_ALIGN(sizeof(sortedSymbol_t) * (HUF_SYMBOLVALUE_MAX + 1), sizeof(U32)) >> 2;
    weightList = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    rankStart = rankStart0 + 1;
    memset(rankStats, 0, sizeof(U32) * (2 * HUF_TABLELOG_MAX + 2 + 1));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(weightList, HUF_SYMBOLVALUE_MAX + 1, rankStats, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 current = nextRankStart;
            nextRankStart += rankStats[w];
            rankStart[w] = current;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = weightList[s];
            U32 const r = rankStart[w]++;
            sortedSymbol[r].symbol = (BYTE)s;
            sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 current = nextRankVal;
                nextRankVal += rankStats[w] << (w+rescale);
                rankVal0[w] = current;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   sortedSymbol, sizeOfSort,
                   rankStart0, rankVal, maxW,
                   tableLog+1);

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}